

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.h
# Opt level: O0

void StringFormatter<unsigned_long&,std::vector<unsigned_short,std::allocator<unsigned_short>>>::
     format<std::vector<unsigned_short,std::allocator<unsigned_short>>const>
               (ostream *os,char *fmt,vector<unsigned_short,_std::allocator<unsigned_short>_> *value
               )

{
  char cVar1;
  bool bVar2;
  char *pcVar3;
  long lVar4;
  char *pcVar5;
  runtime_error *this;
  bool local_b2;
  bool local_9a;
  vector<unsigned_short,_std::allocator<unsigned_short>_> local_98;
  byte local_69;
  vector<unsigned_short,_std::allocator<unsigned_short>_> local_68;
  char local_4e;
  byte local_4d;
  int local_4c;
  char type;
  bool haveprecision;
  int precision;
  bool havewidth;
  char *pcStack_40;
  int width;
  char *q;
  char padchar;
  bool forcesign;
  char *pcStack_30;
  bool leftadjust;
  char *p;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *pvStack_20;
  bool used_value;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *value_local;
  char *fmt_local;
  ostream *os_local;
  
  p._7_1_ = 0;
  pcStack_30 = fmt;
  pvStack_20 = value;
  value_local = (vector<unsigned_short,_std::allocator<unsigned_short>_> *)fmt;
  fmt_local = (char *)os;
  while( true ) {
    while( true ) {
      if (*pcStack_30 == '\0') {
        if ((p._7_1_ & 1) != 0) {
          return;
        }
        this = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this,"too many arguments for format");
        __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      if (*pcStack_30 == '%') break;
      cVar1 = *pcStack_30;
      pcStack_30 = pcStack_30 + 1;
      std::operator<<((ostream *)fmt_local,cVar1);
    }
    pcVar3 = pcStack_30 + 1;
    if (*pcVar3 != '%') break;
    pcStack_30 = pcStack_30 + 2;
    std::operator<<((ostream *)fmt_local,*pcVar3);
  }
  q._7_1_ = *pcVar3 == '-';
  if ((bool)q._7_1_) {
    pcVar3 = pcStack_30 + 2;
  }
  pcStack_30 = pcVar3;
  q._6_1_ = 0;
  if (*pcStack_30 == '+') {
    pcStack_30 = pcStack_30 + 1;
    q._6_1_ = 1;
  }
  else if (*pcStack_30 == ' ') {
    pcStack_30 = pcStack_30 + 1;
  }
  q._5_1_ = 0x20;
  if (*pcStack_30 == '0') {
    pcStack_30 = pcStack_30 + 1;
    q._5_1_ = 0x30;
  }
  else if (*pcStack_30 == ',') {
    pcStack_30 = pcStack_30 + 1;
    q._5_1_ = 0x2c;
  }
  lVar4 = strtol(pcStack_30,&stack0xffffffffffffffc0,10);
  precision = (int)lVar4;
  haveprecision = pcStack_30 != pcStack_40;
  pcStack_30 = pcStack_40;
  local_4c = 0;
  local_4d = 0;
  if (*pcStack_40 == '.') {
    pcStack_30 = pcStack_40 + 1;
    lVar4 = strtol(pcStack_30,&stack0xffffffffffffffc0,10);
    local_4c = (int)lVar4;
    local_4d = pcStack_30 != pcStack_40;
    pcStack_30 = pcStack_40;
  }
  while (pcVar3 = strchr("qhlLzjt",(int)*pcStack_30), pcVar3 != (char *)0x0) {
    pcStack_30 = pcStack_30 + 1;
  }
  pcVar3 = pcStack_30;
  if ((*pcStack_30 == 'I') &&
     ((pcStack_30[2] == '6' || (pcVar3 = pcStack_30 + 1, pcStack_30[2] == '4')))) {
    pcVar3 = pcStack_30 + 3;
  }
  pcStack_30 = pcVar3;
  local_4e = '\0';
  if (*pcStack_30 != '\0') {
    local_4e = *pcStack_30;
    pcStack_30 = pcStack_30 + 1;
  }
  StringFormatter<unsigned_long_&,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>::
  applytype((ostream *)fmt_local,local_4e);
  if ((q._6_1_ & 1) == 0) {
    std::ostream::operator<<(fmt_local,std::noshowpos);
  }
  else {
    std::ostream::operator<<(fmt_local,std::showpos);
  }
  if ((q._7_1_ & 1) == 0) {
    if ((q._6_1_ & 1) != 0) {
      std::ostream::operator<<(fmt_local,std::internal);
    }
  }
  else {
    std::ostream::operator<<(fmt_local,std::left);
  }
  if ((haveprecision & 1U) == 0) {
    std::ios_base::width((ios_base *)(fmt_local + *(long *)(*(long *)fmt_local + -0x18)),0);
  }
  else {
    std::ios_base::width
              ((ios_base *)(fmt_local + *(long *)(*(long *)fmt_local + -0x18)),(long)precision);
    if (((q._7_1_ & 1) == 0) && ((q._6_1_ & 1) == 0)) {
      std::ostream::operator<<(fmt_local,std::right);
    }
  }
  if ((local_4d & 1) != 0) {
    std::ios_base::precision
              ((ios_base *)(fmt_local + *(long *)(*(long *)fmt_local + -0x18)),(long)local_4c);
  }
  std::ios::fill((char)fmt_local + (char)*(undefined8 *)(*(long *)fmt_local + -0x18));
  if ((((local_4e != 'c') ||
       (bVar2 = output_wchar<std::vector<unsigned_short,std::allocator<unsigned_short>>>
                          ((ostream *)fmt_local,pvStack_20), !bVar2)) &&
      ((local_4e != 'p' ||
       (bVar2 = output_pointer<std::vector<unsigned_short,std::allocator<unsigned_short>>>
                          ((ostream *)fmt_local,pvStack_20), !bVar2)))) &&
     ((local_4e != 'b' ||
      (bVar2 = output_hex_data<std::vector<unsigned_short,std::allocator<unsigned_short>>>
                         ((ostream *)fmt_local,pvStack_20), !bVar2)))) {
    pcVar5 = strchr("iduoxX",(int)local_4e);
    pcVar3 = fmt_local;
    local_69 = 0;
    local_9a = false;
    if (pcVar5 != (char *)0x0) {
      std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector(&local_68,pvStack_20);
      local_69 = 1;
      local_9a = output_int<std::vector<unsigned_short,std::allocator<unsigned_short>>>
                           ((ostream *)pcVar3,&local_68);
    }
    if ((local_69 & 1) != 0) {
      std::vector<unsigned_short,_std::allocator<unsigned_short>_>::~vector(&local_68);
    }
    pcVar3 = fmt_local;
    if (local_9a == false) {
      local_b2 = false;
      if (local_4e == 's') {
        std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector(&local_98,pvStack_20);
        local_b2 = output_null<std::vector<unsigned_short,std::allocator<unsigned_short>>>
                             ((ostream *)pcVar3,&local_98);
        std::vector<unsigned_short,_std::allocator<unsigned_short>_>::~vector(&local_98);
      }
      if ((local_b2 == false) &&
         (bVar2 = output_using_operator<std::vector<unsigned_short,std::allocator<unsigned_short>>>
                            ((ostream *)fmt_local,pvStack_20), !bVar2)) {
        std::operator<<((ostream *)fmt_local,"<?>");
      }
    }
  }
  std::ios_base::precision((ios_base *)(fmt_local + *(long *)(*(long *)fmt_local + -0x18)),0);
  p._7_1_ = 1;
  StringFormatter<unsigned_long_&,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>::
  format((ostream *)fmt_local,pcStack_30);
  return;
}

Assistant:

static void format(std::ostream& os, const char *fmt, T& value, FARGS&&...args) 
    {
        bool used_value = false;
        const char *p= fmt;
        while (*p) {
            if (*p=='%') {
                p++;
                if (*p=='%') {
                    os << *p++;
                }
                else {

                    // '-'  means left adjust
                    bool leftadjust= false;
                    if (*p=='-') {
                        p++;
                        leftadjust= true;
                    }
                    bool forcesign= false;
                    //bool blankforpositive= false;
                    if (*p=='+') {
                        p++;
                        forcesign= true;
                    }
                    else if (*p==' ') {
                        p++;
                        //blankforpositive= true;  // <-- todo
                    }
                    
                    // '0' means pad with zero
                    // ',' is useful for arrays
                    char padchar= ' ';

                    if (*p=='0') { p++; padchar='0'; }
                    else if (*p==',') { p++; padchar=','; }

                    // width specification
                    char *q;
                    // todo: support '*'  : take size from argumentlist.
                    // todo: support '#'  : adds 0, 0x, 0X prefix to oct/hex numbers -> 'showbase'
                    int width= strtol(p, &q, 10);
                    bool havewidth= p!=q;
                    p= q;

                    // precision after '.'
                    int precision= 0;
                    bool haveprecision= false;
                    if (*p=='.') {
                        p++;
                        // todo: support '*'
                        precision= strtol(p, &q, 10);
                        haveprecision= p!=q;
                        p= q;
                    }

                    // ignore argument size field
                    while (std::strchr("qhlLzjt", *p))
                        p++;
                    if (*p=='I') {
                        // microsoft I64 specifier
                        p++;
                        if (p[1]=='6' || p[1]=='4') {
                            p+=2;
                        }
                    }

                    char type= 0;
                    if (*p)
                        type= *p++;

                    // use formatting
                    applytype(os, type);
                    if (forcesign)
                        os << std::showpos;
                    else
                        os << std::noshowpos;

                    if (leftadjust)
                        os << std::left;
                    else if (forcesign) {
                        // exception: when forcing display of sign
                        // we need to use 'internal fill'
                        os << std::internal;
                    }

                    if (havewidth) {
                        os.width(width);
                        if (!leftadjust && !forcesign)
                            os << std::right;
                    }
                    else {
                        os.width(0);
                    }
                    // todo: support precision(truncate) for strings
                    if (haveprecision)
                        os.precision(precision);
                    os.fill(padchar);

                    if (type=='c' && output_wchar(os, value))
                    {
                        // nop
                    }
                    else if (type=='p' && output_pointer(os, value))
                    {
                        // nop
                    }
                    else if (type=='b' && output_hex_data(os, value))
                    {
                        // nop
                    }
                    else if (std::strchr("iduoxX", type) && output_int(os, value))
                    {
                        // nop
                    }
                    else if (type=='s' && output_null(os, value))
                    {
                        // nop
                    }
                    else if (output_using_operator(os, value))
                    {
                        // when type ~ float/double : '[AEFGaefg]' || type == 's' || other outputs failed.
                        // nop
                    }
                    else {
                        os << "<?>";
                    }

                    // TODO: improve float formatting

                    // reset precision
                    os.precision(0);

                    used_value = true;

                    format(os, p, args...);
                    return;
                }
            }
            else {
                os << *p++;
            }
        }

        if (!used_value)
            throw std::runtime_error("too many arguments for format");
    }